

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Variant.hpp
# Opt level: O1

Variant * __thiscall Variant::operator=(Variant *this,Variant *other)

{
  usize *puVar1;
  Data *pDVar2;
  data dVar3;
  undefined4 uVar4;
  
  if (other != this) {
    if (other->data->ref == 0) {
      clear(this);
      this->data = &this->_data;
      pDVar2 = other->data;
      (this->_data).ref = pDVar2->ref;
      uVar4 = *(undefined4 *)&pDVar2->field_0x4;
      dVar3 = pDVar2->data;
      (this->_data).type = pDVar2->type;
      *(undefined4 *)&(this->_data).field_0x4 = uVar4;
      (this->_data).data = dVar3;
    }
    else {
      LOCK();
      puVar1 = &other->data->ref;
      *puVar1 = *puVar1 + 1;
      UNLOCK();
      clear(this);
      this->data = other->data;
    }
  }
  return this;
}

Assistant:

Variant& operator=(const Variant& other)
  {
    if(&other != this)
    {
      if(other.data->ref)
      {
        Atomic::increment(other.data->ref);
        clear();
        data = other.data;
      }
      else //if(&other != this)
      {
        clear();
        data = &_data;
        _data = *other.data;
      }
    }
    return *this;
  }